

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O0

vec2 golf_graphics_world_to_screen(vec3 world_pos)

{
  vec2 vVar1;
  mat4 m;
  vec4 vVar2;
  vec4 b;
  undefined4 uStack_48;
  undefined4 uStack_44;
  vec4 t;
  undefined4 local_20;
  undefined4 uStack_1c;
  vec3 world_pos_local;
  
  local_20 = world_pos.x;
  uStack_1c = world_pos.y;
  vVar2 = vec4_create(local_20,uStack_1c,world_pos.z,1.0);
  m.m[2] = graphics.proj_view_mat.m[2];
  m.m[3] = graphics.proj_view_mat.m[3];
  m.m[0] = graphics.proj_view_mat.m[0];
  m.m[1] = graphics.proj_view_mat.m[1];
  m.m[4] = graphics.proj_view_mat.m[4];
  m.m[5] = graphics.proj_view_mat.m[5];
  m.m[6] = graphics.proj_view_mat.m[6];
  m.m[7] = graphics.proj_view_mat.m[7];
  m.m[8] = graphics.proj_view_mat.m[8];
  m.m[9] = graphics.proj_view_mat.m[9];
  m.m[10] = graphics.proj_view_mat.m[10];
  m.m[0xb] = graphics.proj_view_mat.m[0xb];
  m.m[0xc] = graphics.proj_view_mat.m[0xc];
  m.m[0xd] = graphics.proj_view_mat.m[0xd];
  m.m[0xe] = graphics.proj_view_mat.m[0xe];
  m.m[0xf] = graphics.proj_view_mat.m[0xf];
  vVar2 = vec4_apply_mat(vVar2,m);
  t.y = vVar2.w;
  vVar2 = vec4_scale(vVar2,0.5 / t.y);
  b = vec4_create(0.5,0.5,0.0,0.0);
  vVar2 = vec4_add(vVar2,b);
  uStack_48 = vVar2.x;
  uStack_44 = vVar2.y;
  vVar1 = vec2_create(uStack_48 * graphics.viewport_size.x + graphics.viewport_pos.x,
                      (1.0 - uStack_44) * graphics.viewport_size.y + graphics.viewport_pos.y);
  return vVar1;
}

Assistant:

vec2 golf_graphics_world_to_screen(vec3 world_pos) {
    vec4 t = V4(world_pos.x, world_pos.y, world_pos.z, 1);
    t = vec4_apply_mat(t, graphics.proj_view_mat);
    t = vec4_scale(t, 0.5f / t.w);
    t = vec4_add(t, V4(0.5f, 0.5f, 0, 0));
    t.y = 1 - t.y;
    t.x = t.x * graphics.viewport_size.x;
    t.y = t.y * graphics.viewport_size.y;
    t.x = t.x + graphics.viewport_pos.x;
    t.y = t.y + graphics.viewport_pos.y;
    return V2(t.x, t.y);
}